

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

Vec_Wec_t * Str_ManDeriveTrees(Gia_Man_t *p)

{
  byte *pbVar1;
  uint *puVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  long lVar5;
  Vec_Str_t *vStr;
  char *pcVar6;
  Abc_Nam_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *pVVar7;
  long lVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  uint uVar11;
  Gia_Obj_t *pGVar12;
  int fFound;
  int local_3c;
  Vec_Str_t *local_38;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x172,"Vec_Wec_t *Str_ManDeriveTrees(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  uVar10 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar5 = 0;
    lVar8 = 0;
    do {
      puVar2 = p->pMuxes;
      if ((puVar2 != (uint *)0x0) && (puVar2[lVar8] != 0)) {
        pGVar3 = p->pObjs;
        uVar11 = (uint)*(undefined8 *)(&pGVar3->field_0x0 + lVar5) & 0x1fffffff;
        pGVar12 = (Gia_Obj_t *)(lVar5 + (ulong)(uVar11 * 4) * -3 + (long)pGVar3);
        if ((pGVar12 < pGVar3) || (pGVar3 + (int)uVar10 <= pGVar12)) {
LAB_007d8867:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (((puVar2 != (uint *)0x0) &&
            (puVar2[(int)(lVar5 + (ulong)(uVar11 * 4) * -3 >> 2) * -0x55555555] != 0)) &&
           (p->pRefs[(int)(lVar5 + (ulong)(uVar11 << 2) * -3 >> 2) * -0x55555555] == 1)) {
          pbVar1 = (byte *)((long)pGVar3 + lVar5 + (ulong)(uVar11 * 4) * -3 + 3);
          *pbVar1 = *pbVar1 | 0x40;
        }
        uVar11 = *(uint *)(&pGVar3->field_0x4 + lVar5) & 0x1fffffff;
        pGVar9 = (Gia_Obj_t *)((long)pGVar3 + (ulong)(uVar11 * 4) * -3 + lVar5);
        pGVar12 = p->pObjs;
        if ((pGVar9 < pGVar12) || (pGVar12 + p->nObjs <= pGVar9)) goto LAB_007d8867;
        if (((p->pMuxes != (uint *)0x0) &&
            (p->pMuxes[(int)((long)pGVar3 + lVar5 + ((ulong)(uVar11 * 4) * -3 - (long)pGVar12) >> 2)
                       * -0x55555555] != 0)) &&
           (p->pRefs[(int)((long)pGVar3 + lVar5 + ((ulong)(uVar11 << 2) * -3 - (long)pGVar12) >> 2)
                     * -0x55555555] == 1)) {
          pGVar9->field_0x3 = pGVar9->field_0x3 | 0x40;
        }
      }
      lVar8 = lVar8 + 1;
      uVar10 = (ulong)p->nObjs;
      lVar5 = lVar5 + 0xc;
    } while (lVar8 < (long)uVar10);
  }
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar6 = (char *)malloc(1000);
  vStr->pArray = pcVar6;
  p_00 = Abc_NamStart(10000,0x32);
  p_01 = (Vec_Wec_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  pVVar7 = (Vec_Int_t *)calloc(1000,0x10);
  p_01->pArray = pVVar7;
  Vec_WecPushLevel(p_01);
  if (0 < p->nObjs) {
    lVar8 = 0;
    lVar5 = 0;
    local_38 = vStr;
    do {
      if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[lVar5] != 0)) {
        pGVar3 = p->pObjs;
        uVar11 = (uint)*(ulong *)(&pGVar3->field_0x0 + lVar8);
        if (((uVar11 >> 0x1e & 1) == 0) &&
           (((*(byte *)((long)pGVar3 + lVar8 + (ulong)((uVar11 & 0x1fffffff) << 2) * -3 + 3) & 0x40)
             != 0 || ((*(byte *)((long)pGVar3 +
                                lVar8 + (ulong)((uint)(*(ulong *)(&pGVar3->field_0x0 + lVar8) >>
                                                      0x1e) & 0x7ffffffc) * -3 + 3) & 0x40) != 0))))
        {
          Str_MuxStructDump(p,(Gia_Obj_t *)(&pGVar3->field_0x0 + lVar8),vStr);
          uVar11 = Abc_NamStrFindOrAdd(p_00,vStr->pArray,&local_3c);
          if (local_3c == 0) {
            Vec_WecPushLevel(p_01);
          }
          iVar4 = Abc_NamObjNumMax(p_00);
          if (iVar4 != p_01->nSize) {
            __assert_fail("Abc_NamObjNumMax(pNames) == Vec_WecSize(vGroups)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                          ,0x192,"Vec_Wec_t *Str_ManDeriveTrees(Gia_Man_t *)");
          }
          if (((int)uVar11 < 0) || (p_01->nSize <= (int)uVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(p_01->pArray + uVar11,(int)lVar5);
          vStr = local_38;
        }
      }
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0xc;
    } while (lVar5 < p->nObjs);
  }
  Abc_NamStop(p_00);
  if (vStr->pArray != (char *)0x0) {
    free(vStr->pArray);
    vStr->pArray = (char *)0x0;
  }
  free(vStr);
  return p_01;
}

Assistant:

Vec_Wec_t * Str_ManDeriveTrees( Gia_Man_t * p )
{
    int fPrintStructs = 0;
    Abc_Nam_t * pNames; 
    Vec_Wec_t * vGroups;  
    Vec_Str_t * vStr;
    Gia_Obj_t * pObj, * pFanin;
    int i, iStructId, fFound;
    assert( p->pMuxes != NULL );
    // mark MUXes whose only fanout is a MUX
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    Gia_ManForEachMuxId( p, i )
    {
        pObj = Gia_ManObj(p, i);
        pFanin = Gia_ObjFanin0(pObj);
        if ( Gia_ObjIsMux(p, pFanin) && Gia_ObjRefNum(p, pFanin) == 1 )
            pFanin->fMark0 = 1;
        pFanin = Gia_ObjFanin1(pObj);
        if ( Gia_ObjIsMux(p, pFanin) && Gia_ObjRefNum(p, pFanin) == 1 )
            pFanin->fMark0 = 1;
    }
    // traverse for top level MUXes
    vStr   = Vec_StrAlloc( 1000 );
    pNames = Abc_NamStart( 10000, 50 );
    vGroups = Vec_WecAlloc( 1000 );
    Vec_WecPushLevel( vGroups );
    Gia_ManForEachMuxId( p, i )
    {
        // skip internal
        pObj = Gia_ManObj(p, i);
        if ( pObj->fMark0 )
            continue;
        // skip trees of size one
        if ( !Gia_ObjFanin0(pObj)->fMark0 && !Gia_ObjFanin1(pObj)->fMark0 )
            continue;
        // hash the tree
        Str_MuxStructDump( p, pObj, vStr );
        iStructId = Abc_NamStrFindOrAdd( pNames, Vec_StrArray(vStr), &fFound );
        if ( !fFound ) Vec_WecPushLevel( vGroups );
        assert( Abc_NamObjNumMax(pNames) == Vec_WecSize(vGroups) );
        Vec_IntPush( Vec_WecEntry(vGroups, iStructId), i );
    }
    if ( fPrintStructs )
    {
        char * pTemp; 
        Abc_NamManForEachObj( pNames, pTemp, i )
        {
            printf( "%5d : ", i );
            printf( "Occur = %4d   ", Vec_IntSize(Vec_WecEntry(vGroups,i)) );
            printf( "Size = %4d   ",  Str_ManMuxCountOne(pTemp) );
            printf( "%s\n", pTemp );
        }
    }
    Abc_NamStop( pNames );
    Vec_StrFree( vStr );
    return vGroups;
}